

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O1

size_t __thiscall
libtorrent::aux::utp_socket_impl::write_some(utp_socket_impl *this,bool clear_buffers)

{
  pointer psVar1;
  bool bVar2;
  
  this->m_written = 0;
  do {
    bVar2 = send_pkt(this,0);
  } while (bVar2);
  if (clear_buffers) {
    this->m_write_buffer_size = 0;
    psVar1 = (this->m_write_buffer).
             super__Vector_base<libtorrent::span<const_char>,_std::allocator<libtorrent::span<const_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_write_buffer).
        super__Vector_base<libtorrent::span<const_char>,_std::allocator<libtorrent::span<const_char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar1) {
      (this->m_write_buffer).
      super__Vector_base<libtorrent::span<const_char>,_std::allocator<libtorrent::span<const_char>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar1;
    }
  }
  return (long)this->m_written;
}

Assistant:

std::size_t utp_socket_impl::write_some(bool const clear_buffers)
{
	m_written = 0;

	// try to write if the congestion window allows it
	while (send_pkt());

	if (clear_buffers)
	{
		m_write_buffer_size = 0;
		m_write_buffer.clear();
	}

	return std::size_t(m_written);
}